

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

void __thiscall
amrex::AmrLevel::AmrLevel
          (AmrLevel *this,Amr *papa,int lev,Geometry *level_geom,BoxArray *ba,
          DistributionMapping *dm,Real time)

{
  pointer *ppiVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pIVar3;
  FabFactory<amrex::FArrayBox> *pFVar4;
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  IndexSpace *pIVar12;
  FabFactory<amrex::FArrayBox> *pFVar13;
  long *plVar14;
  undefined8 *puVar15;
  StateDescriptor *d;
  size_type *psVar16;
  ulong uVar17;
  long *plVar18;
  ulong *puVar19;
  BoxArray *pBVar20;
  pointer piVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  initializer_list<int> __l;
  string __str;
  uint __uval;
  RegionTag statedata_index_new_tag;
  RegionTag statedata_index_tag;
  RegionTag statedata_tag;
  string __str_1;
  string __str_2;
  RegionTag level_tag;
  vector<int,_std::allocator<int>_> local_190;
  long lStack_178;
  uint local_16c;
  AmrLevel *local_168;
  RegionTag local_15b;
  RegionTag local_15a;
  RegionTag local_159;
  pointer *local_158;
  long local_150;
  pointer local_148 [2];
  BoxArray *local_138;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_130 [2];
  FabFactory<amrex::FArrayBox> local_120 [2];
  undefined8 local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *local_b0;
  BoxArray *local_a8;
  long local_a0;
  DistributionMapping *local_98;
  string local_90;
  string local_70;
  BoxArray *local_50;
  BoxArray *local_48;
  Box *local_40;
  Real local_38;
  
  this->_vptr_AmrLevel = (_func_int **)&PTR__AmrLevel_0080db80;
  local_38 = time;
  memcpy(&this->geom,level_geom,200);
  local_a8 = &this->grids;
  local_138 = ba;
  BoxArray::BoxArray(local_a8,ba);
  (this->dmap).m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (dm->m_ref).
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (dm->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->dmap).m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_b0 = &this->state;
  local_48 = &this->m_AreaNotToTag;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fine_ratio).vect[1] = 0;
  (this->fine_ratio).vect[2] = 0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->crse_ratio).vect[0] = 0;
  (this->crse_ratio).vect[1] = 0;
  *(undefined8 *)((this->crse_ratio).vect + 2) = 0;
  local_98 = dm;
  BoxArray::BoxArray(local_48);
  (this->m_AreaToTag).smallend.vect[0] = 1;
  (this->m_AreaToTag).smallend.vect[1] = 1;
  (this->m_AreaToTag).smallend.vect[2] = 1;
  (this->m_AreaToTag).bigend.vect[0] = 0;
  (this->m_AreaToTag).bigend.vect[1] = 0;
  *(undefined8 *)((this->m_AreaToTag).bigend.vect + 2) = 0;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::FArrayBox> *)0x0;
  pBVar20 = (BoxArray *)&this->field_0x220;
  lVar24 = 0;
  local_168 = this;
  do {
    BoxArray::BoxArray(pBVar20);
    lVar24 = lVar24 + -0x68;
    pBVar20 = pBVar20 + 1;
  } while (lVar24 != -0x138);
  local_50 = &this->nodal_grids;
  BoxArray::BoxArray(local_50);
  this->level = lev;
  this->parent = papa;
  this->levelDirectoryCreated = false;
  (this->fine_ratio).vect[0] = -1;
  (this->fine_ratio).vect[1] = -1;
  (this->fine_ratio).vect[2] = -1;
  (this->crse_ratio).vect[0] = -1;
  (this->crse_ratio).vect[1] = -1;
  (this->crse_ratio).vect[2] = -1;
  if (0 < lev) {
    pIVar3 = (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = pIVar3[(ulong)(uint)lev - 1].vect[2];
    *(undefined8 *)(this->crse_ratio).vect = *(undefined8 *)pIVar3[(ulong)(uint)lev - 1].vect;
    (this->crse_ratio).vect[2] = iVar9;
  }
  local_a0 = (long)lev;
  if (lev < (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    pIVar3 = (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = pIVar3[local_a0].vect[2];
    *(undefined8 *)(this->fine_ratio).vect = *(undefined8 *)pIVar3[local_a0].vect;
    (this->fine_ratio).vect[2] = iVar9;
  }
  iVar9 = DescriptorList::size((DescriptorList *)desc_lst);
  std::vector<amrex::StateData,_std::allocator<amrex::StateData>_>::resize
            (&local_b0->super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>,
             (long)iVar9);
  pIVar12 = EB2::TopIndexSpaceIfPresent();
  if (pIVar12 == (IndexSpace *)0x0) {
    pFVar13 = (FabFactory<amrex::FArrayBox> *)operator_new(8);
    pFVar13->_vptr_FabFactory = (_func_int **)&PTR__FabFactory_0080b918;
    pFVar4 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl = pFVar13;
    if (pFVar4 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar4->_vptr_FabFactory[1])();
    }
  }
  else {
    local_110 = (long *)CONCAT44(m_eb_volume_grow_cells,m_eb_basic_grow_cells);
    local_108 = CONCAT44(local_108._4_4_,m_eb_full_grow_cells);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_110;
    std::vector<int,_std::allocator<int>_>::vector(&local_190,__l,(allocator_type *)&local_158);
    makeEBFabFactory((amrex *)local_130,&this->geom,local_138,local_98,
                     (Vector<int,_std::allocator<int>_> *)&local_190,m_eb_support_level);
    _Var8._M_head_impl = local_130[0]._M_head_impl;
    local_130[0]._M_head_impl = (FabFactory<amrex::FArrayBox> *)0x0;
    pFVar4 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         _Var8._M_head_impl;
    if (pFVar4 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar4->_vptr_FabFactory[1])();
      if (local_130[0]._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
        (*(local_130[0]._M_head_impl)->_vptr_FabFactory[1])();
      }
    }
    local_130[0]._M_head_impl = (FabFactory<amrex::FArrayBox> *)0x0;
    if ((pointer *)
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  pSVar5 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar6 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar5 != pSVar6 && -1 < (long)pSVar5 - (long)pSVar6) {
    uVar26 = -lev;
    if (0 < lev) {
      uVar26 = lev;
    }
    local_138 = (BoxArray *)(ulong)((uint)lev >> 0x1f);
    local_40 = &(this->geom).domain;
    uVar25 = 0;
    local_16c = uVar26;
    do {
      pBVar20 = local_138;
      uVar22 = 1;
      if (9 < uVar26) {
        uVar23 = 4;
        do {
          uVar22 = uVar23;
          if (uVar26 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_005b4995;
          }
          if (uVar26 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_005b4995;
          }
          if (uVar26 < 10000) goto LAB_005b4995;
          bVar7 = 99999 < uVar26;
          uVar23 = uVar22 + 4;
          uVar26 = uVar26 / 10000;
        } while (bVar7);
        uVar22 = uVar22 + 1;
      }
LAB_005b4995:
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_138 + (char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)pBVar20),uVar22,local_16c);
      plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x775e18);
      uVar26 = local_16c;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      psVar16 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_70.field_2._M_allocated_capacity = *psVar16;
        local_70.field_2._8_8_ = plVar14[3];
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar16;
        local_70._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_70._M_string_length = plVar14[1];
      *plVar14 = (long)psVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      FabArrayBase::RegionTag::RegionTag(&local_159,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      uVar22 = 1;
      uVar23 = (uint)uVar25;
      if (9 < uVar25) {
        uVar11 = 4;
        uVar17 = uVar25;
        do {
          uVar22 = uVar11;
          uVar10 = (uint)uVar17;
          if (uVar10 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_005b4aea;
          }
          if (uVar10 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_005b4aea;
          }
          if (uVar10 < 10000) goto LAB_005b4aea;
          uVar17 = (uVar17 & 0xffffffff) / 10000;
          uVar11 = uVar22 + 4;
        } while (99999 < uVar10);
        uVar22 = uVar22 + 1;
      }
LAB_005b4aea:
      local_130[0]._M_head_impl = local_120;
      std::__cxx11::string::_M_construct((ulong)local_130,(char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_130[0]._M_head_impl,uVar22,uVar23);
      plVar14 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x775e29);
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_100 = *plVar18;
        lStack_f8 = plVar14[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar18;
        local_110 = (long *)*plVar14;
      }
      local_108 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_110);
      pBVar20 = local_138;
      puVar19 = (ulong *)(plVar14 + 2);
      if ((pointer *)*plVar14 == (pointer *)puVar19) {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar19;
        lStack_178 = plVar14[3];
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar19;
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar14;
      }
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar14[1];
      *plVar14 = (long)puVar19;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      uVar22 = 1;
      if (9 < uVar26) {
        uVar11 = uVar26;
        uVar10 = 4;
        do {
          uVar22 = uVar10;
          if (uVar11 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_005b4c2b;
          }
          if (uVar11 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_005b4c2b;
          }
          if (uVar11 < 10000) goto LAB_005b4c2b;
          bVar7 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar10 = uVar22 + 4;
        } while (bVar7);
        uVar22 = uVar22 + 1;
      }
LAB_005b4c2b:
      local_158 = local_148;
      std::__cxx11::string::_M_construct((ulong)&local_158,(char)local_138 + (char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_158 + (long)pBVar20),uVar22,uVar26);
      ppiVar1 = &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      piVar21 = (pointer)0xf;
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar1) {
        piVar21 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      if (piVar21 < (pointer)(local_150 +
                             (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish)) {
        piVar21 = (pointer)0xf;
        if (local_158 != local_148) {
          piVar21 = local_148[0];
        }
        if (piVar21 < (pointer)(local_150 +
                               (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish)) goto LAB_005b4cb2;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_158,0,(char *)0x0,
                             (ulong)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
      }
      else {
LAB_005b4cb2:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_158)
        ;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar16 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_d0.field_2._M_allocated_capacity = *psVar16;
        local_d0.field_2._8_8_ = puVar15[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar16;
        local_d0._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_d0._M_string_length = puVar15[1];
      *puVar15 = psVar16;
      puVar15[1] = 0;
      *(undefined1 *)psVar16 = 0;
      FabArrayBase::RegionTag::RegionTag(&local_15a,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_158 != local_148) {
        operator_delete(local_158,(long)local_148[0] + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar1) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_130[0]._M_head_impl != local_120) {
        operator_delete(local_130[0]._M_head_impl,(long)local_120[0]._vptr_FabFactory + 1);
      }
      uVar22 = 1;
      if (9 < uVar25) {
        uVar11 = 4;
        uVar17 = uVar25;
        do {
          uVar22 = uVar11;
          uVar10 = (uint)uVar17;
          if (uVar10 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_005b4e14;
          }
          if (uVar10 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_005b4e14;
          }
          if (uVar10 < 10000) goto LAB_005b4e14;
          uVar17 = (uVar17 & 0xffffffff) / 10000;
          uVar11 = uVar22 + 4;
        } while (99999 < uVar10);
        uVar22 = uVar22 + 1;
      }
LAB_005b4e14:
      local_130[0]._M_head_impl = local_120;
      std::__cxx11::string::_M_construct((ulong)local_130,(char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_130[0]._M_head_impl,uVar22,uVar23);
      plVar14 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x775e29);
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_100 = *plVar18;
        lStack_f8 = plVar14[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar18;
        local_110 = (long *)*plVar14;
      }
      local_108 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_110);
      pBVar20 = local_138;
      puVar19 = (ulong *)(plVar14 + 2);
      if ((pointer *)*plVar14 == (pointer *)puVar19) {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar19;
        lStack_178 = plVar14[3];
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*puVar19;
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)*plVar14;
      }
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar14[1];
      *plVar14 = (long)puVar19;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      uVar22 = 1;
      if (9 < uVar26) {
        uVar11 = uVar26;
        uVar10 = 4;
        do {
          uVar22 = uVar10;
          if (uVar11 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_005b4f58;
          }
          if (uVar11 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_005b4f58;
          }
          if (uVar11 < 10000) goto LAB_005b4f58;
          bVar7 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar10 = uVar22 + 4;
        } while (bVar7);
        uVar22 = uVar22 + 1;
      }
LAB_005b4f58:
      local_158 = local_148;
      std::__cxx11::string::_M_construct((ulong)&local_158,(char)local_138 + (char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_158 + (long)pBVar20),uVar22,uVar26);
      ppiVar1 = &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      piVar21 = (pointer)0xf;
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar1) {
        piVar21 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      if (piVar21 < (pointer)(local_150 +
                             (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish)) {
        piVar21 = (pointer)0xf;
        if (local_158 != local_148) {
          piVar21 = local_148[0];
        }
        if (piVar21 < (pointer)(local_150 +
                               (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish)) goto LAB_005b4fdf;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_158,0,(char *)0x0,
                             (ulong)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
      }
      else {
LAB_005b4fdf:
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_158)
        ;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      psVar16 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_f0.field_2._M_allocated_capacity = *psVar16;
        local_f0.field_2._8_8_ = puVar15[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar16;
        local_f0._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_f0._M_string_length = puVar15[1];
      *puVar15 = psVar16;
      puVar15[1] = 0;
      *(undefined1 *)psVar16 = 0;
      FabArrayBase::RegionTag::RegionTag(&local_15b,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_158 != local_148) {
        operator_delete(local_158,(long)local_148[0] + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != ppiVar1) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_130[0]._M_head_impl != local_120) {
        operator_delete(local_130[0]._M_head_impl,(long)local_120[0]._vptr_FabFactory + 1);
      }
      pBVar20 = local_138;
      uVar22 = 1;
      if (9 < uVar26) {
        uVar11 = 4;
        do {
          uVar22 = uVar11;
          if (uVar26 < 100) {
            uVar22 = uVar22 - 2;
            goto LAB_005b5147;
          }
          if (uVar26 < 1000) {
            uVar22 = uVar22 - 1;
            goto LAB_005b5147;
          }
          if (uVar26 < 10000) goto LAB_005b5147;
          bVar7 = 99999 < uVar26;
          uVar26 = uVar26 / 10000;
          uVar11 = uVar22 + 4;
        } while (bVar7);
        uVar22 = uVar22 + 1;
      }
LAB_005b5147:
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_138 + (char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)pBVar20),uVar22,local_16c);
      plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x775e40);
      this = local_168;
      uVar26 = local_16c;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      psVar16 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_90.field_2._M_allocated_capacity = *psVar16;
        local_90.field_2._8_8_ = plVar14[3];
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar16;
        local_90._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_90._M_string_length = plVar14[1];
      *plVar14 = (long)psVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      FabArrayBase::RegionTag::RegionTag((RegionTag *)&local_110,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      pSVar5 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      d = DescriptorList::operator[]((DescriptorList *)desc_lst,uVar23);
      StateData::define(pSVar5 + uVar25,local_40,local_a8,local_98,d,local_38,
                        (this->parent->dt_level).super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[local_a0],
                        (this->m_factory)._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl);
      FabArrayBase::popRegionTag();
      FabArrayBase::popRegionTag();
      FabArrayBase::popRegionTag();
      FabArrayBase::popRegionTag();
      uVar25 = uVar25 + 1;
      lVar24 = ((long)(this->state).
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->state).
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7;
    } while (lVar24 - uVar25 != 0 && (long)uVar25 <= lVar24);
  }
  if ((this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids != false) {
    constructAreaNotToTag(this);
  }
  this->post_step_regrid = 0;
  return;
}

Assistant:

AmrLevel::AmrLevel (Amr&            papa,
                    int             lev,
                    const Geometry& level_geom,
                    const BoxArray& ba,
                    const DistributionMapping& dm,
                    Real            time)
    :
    geom(level_geom),
    grids(ba),
    dmap(dm)
{
    BL_PROFILE("AmrLevel::AmrLevel(dm)");
    level  = lev;
    parent = &papa;
    levelDirectoryCreated = false;

    fine_ratio = IntVect::TheUnitVector(); fine_ratio.scale(-1);
    crse_ratio = IntVect::TheUnitVector(); crse_ratio.scale(-1);

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
    }
    if (level < parent->maxLevel())
    {
        fine_ratio = parent->refRatio(level);
    }

    state.resize(desc_lst.size());

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        m_factory = makeEBFabFactory(geom, ba, dm,
                                     {m_eb_basic_grow_cells,
                                      m_eb_volume_grow_cells,
                                      m_eb_full_grow_cells},
                                     m_eb_support_level);
    } else
#endif
    {
        m_factory = std::make_unique<FArrayBoxFactory>();
    }

    // Note that this creates a distribution map associated with grids.
    for (int i = 0; i < state.size(); i++)
    {
        MultiFab::RegionTag statedata_tag("StateData_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_tag("StateData_" + std::to_string(i) + "_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_new_tag("StateData_" + std::to_string(i) + "_New_Level_" + std::to_string(lev));
        MultiFab::RegionTag level_tag("AmrLevel_Level_" + std::to_string(lev));
        state[i].define(geom.Domain(),
                        grids,
                        dm,
                        desc_lst[i],
                        time,
                        parent->dtLevel(lev),
                        *m_factory);
    }

    if (parent->useFixedCoarseGrids()) constructAreaNotToTag();

    post_step_regrid = 0;

    finishConstructor();
}